

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::RecordConstant(FunctionBody *this,RegSlot location,Var var)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  WriteBarrierPtr<void> *pWVar5;
  
  uVar3 = GetCountField(this,ConstantCount);
  if (uVar3 <= location) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1118,"(location < GetConstantCount())",
                                "location < GetConstantCount()");
    if (!bVar2) goto LAB_00768cdf;
    *puVar4 = 0;
  }
  if ((this->m_constTable).ptr == (WriteBarrierPtr<void> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1119,"(this->GetConstTable())","this->GetConstTable()");
    if (!bVar2) goto LAB_00768cdf;
    *puVar4 = 0;
  }
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x111a,"(var != nullptr)","var != nullptr");
    if (!bVar2) goto LAB_00768cdf;
    *puVar4 = 0;
  }
  pWVar5 = (this->m_constTable).ptr;
  if (pWVar5[location - 1].ptr != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x111b,
                                "(this->GetConstTable()[location - FunctionBody::FirstRegSlot] == nullptr)"
                                ,
                                "this->GetConstTable()[location - FunctionBody::FirstRegSlot] == nullptr"
                               );
    if (!bVar2) {
LAB_00768cdf:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pWVar5 = (this->m_constTable).ptr;
  }
  pWVar5 = pWVar5 + (location - 1);
  Memory::Recycler::WBSetBit((char *)pWVar5);
  pWVar5->ptr = var;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar5);
  return;
}

Assistant:

void FunctionBody::RecordConstant(RegSlot location, Var var)
    {
        Assert(location < GetConstantCount());
        Assert(this->GetConstTable());
        Assert(var != nullptr);
        Assert(this->GetConstTable()[location - FunctionBody::FirstRegSlot] == nullptr);
        this->GetConstTable()[location - FunctionBody::FirstRegSlot] = var;
    }